

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwMaximizeWindow(GLFWwindow *handle)

{
  long unaff_RBX;
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/glfw/src/window.c"
                  ,0x2e6,"void glfwMaximizeWindow(GLFWwindow *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (*(long *)(handle + 0x40) != 0) {
    return;
  }
  if (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0 &&
      (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0 && _glfw.x11.NET_WM_STATE != 0)) {
    sendEventToWM((_GLFWwindow *)handle,_glfw.x11.NET_WM_STATE,1,
                  _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT,_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ,1,
                  unaff_RBX);
    XFlush(_glfw.x11.display);
    return;
  }
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}